

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O1

void __thiscall StringPieceUtilTestToLowerASCII::Run(StringPieceUtilTestToLowerASCII *this)

{
  testing::Test::Check
            (g_current_test,true,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x71,"\'a\' == ToLowerASCII(\'A\')");
  testing::Test::Check
            (g_current_test,true,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x72,"\'z\' == ToLowerASCII(\'Z\')");
  testing::Test::Check
            (g_current_test,true,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x73,"\'a\' == ToLowerASCII(\'a\')");
  testing::Test::Check
            (g_current_test,true,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x74,"\'z\' == ToLowerASCII(\'z\')");
  testing::Test::Check
            (g_current_test,true,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x75,"\'/\' == ToLowerASCII(\'/\')");
  testing::Test::Check
            (g_current_test,true,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x76,"\'1\' == ToLowerASCII(\'1\')");
  return;
}

Assistant:

TEST(StringPieceUtilTest, ToLowerASCII) {
  EXPECT_EQ('a', ToLowerASCII('A'));
  EXPECT_EQ('z', ToLowerASCII('Z'));
  EXPECT_EQ('a', ToLowerASCII('a'));
  EXPECT_EQ('z', ToLowerASCII('z'));
  EXPECT_EQ('/', ToLowerASCII('/'));
  EXPECT_EQ('1', ToLowerASCII('1'));
}